

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<const_char> *params)

{
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = *(undefined8 *)this;
  uStack_10 = *(undefined8 *)(this + 8);
  _::concat<kj::ArrayPtr<char_const>>(__return_storage_ptr__,(_ *)&local_18,params);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}